

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O3

acmod_t * acmod_init(ps_config_t *config,logmath_t *lmath,fe_t *fe,feat_t *fcb)

{
  int iVar1;
  int iVar2;
  acmod_t *acmod;
  ps_config_t *ppVar3;
  logmath_t *plVar4;
  char *pcVar5;
  bin_mdef_t *pbVar6;
  tmat_t *ptVar7;
  ps_mgau_t *ppVar8;
  ps_mllr_t *mllr;
  int16 *piVar9;
  bitvec_t *pbVar10;
  uint8 *puVar11;
  char *fmt;
  long lVar12;
  double tpfloor;
  
  acmod = (acmod_t *)
          __ckd_calloc__(1,200,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                         ,0xff);
  ppVar3 = ps_config_retain(config);
  acmod->config = ppVar3;
  plVar4 = logmath_retain(lmath);
  acmod->lmath = plVar4;
  acmod->state = '\0';
  iVar1 = acmod_reinit_feat(acmod,fe,fcb);
  if (iVar1 < 0) goto LAB_0011d38b;
  pcVar5 = ps_config_str(acmod->config,"mdef");
  if (pcVar5 == (char *)0x0) {
    pcVar5 = ps_config_str(acmod->config,"hmm");
    if (pcVar5 != (char *)0x0) {
      fmt = "Folder \'%s\' does not contain acoustic model definition \'mdef\'\n";
      lVar12 = 0x49;
      goto LAB_0011d340;
    }
    pcVar5 = "Acoustic model definition is not specified either with -mdef option or with -hmm\n";
    lVar12 = 0x46;
  }
  else {
    pbVar6 = bin_mdef_read(acmod->config,pcVar5);
    acmod->mdef = pbVar6;
    if (pbVar6 == (bin_mdef_t *)0x0) {
      fmt = "Failed to read acoustic model definition from %s\n";
      lVar12 = 0x4f;
LAB_0011d340:
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
              ,lVar12,fmt,pcVar5);
      goto LAB_0011d38b;
    }
    pcVar5 = ps_config_str(acmod->config,"tmat");
    if (pcVar5 == (char *)0x0) {
      pcVar5 = "No tmat file specified\n";
      lVar12 = 0x55;
    }
    else {
      plVar4 = acmod->lmath;
      tpfloor = ps_config_float(acmod->config,"tmatfloor");
      ptVar7 = tmat_init(pcVar5,plVar4,(float64)tpfloor,1);
      acmod->tmat = ptVar7;
      pcVar5 = ps_config_str(acmod->config,"mean");
      if (((pcVar5 != (char *)0x0) &&
          (pcVar5 = ps_config_str(acmod->config,"var"), pcVar5 != (char *)0x0)) &&
         (pcVar5 = ps_config_str(acmod->config,"tmat"), pcVar5 != (char *)0x0)) {
        pcVar5 = ps_config_str(acmod->config,"senmgau");
        if (pcVar5 == (char *)0x0) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                  ,0x6b,"Attempting to use PTM computation module\n");
          ppVar8 = ptm_mgau_init(acmod,acmod->mdef);
          acmod->mgau = ppVar8;
          if (ppVar8 == (ps_mgau_t *)0x0) {
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                    ,0x6d,"Attempting to use semi-continuous computation module\n");
            ppVar8 = s2_semi_mgau_init(acmod);
            acmod->mgau = ppVar8;
            if (ppVar8 == (ps_mgau_t *)0x0) {
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                      ,0x6f,"Falling back to general multi-stream GMM computation\n");
              ppVar8 = ms_mgau_init(acmod,acmod->lmath,acmod->mdef);
              acmod->mgau = ppVar8;
              if (ppVar8 == (ps_mgau_t *)0x0) {
                pcVar5 = "Failed to read acoustic model\n";
                lVar12 = 0x72;
                goto LAB_0011d37f;
              }
            }
          }
        }
        else {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                  ,0x65,"Using general multi-stream GMM computation\n");
          ppVar8 = ms_mgau_init(acmod,acmod->lmath,acmod->mdef);
          acmod->mgau = ppVar8;
          if (ppVar8 == (ps_mgau_t *)0x0) goto LAB_0011d38b;
        }
        pcVar5 = ps_config_str(acmod->config,"mllr");
        if (pcVar5 == (char *)0x0) {
LAB_0011d46b:
          piVar9 = (int16 *)__ckd_calloc__((long)acmod->mdef->n_sen,2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                                           ,0x10e);
          acmod->senone_scores = piVar9;
          iVar2 = acmod->mdef->n_sen;
          iVar1 = iVar2 + 0x1f;
          iVar2 = iVar2 + 0x3e;
          if (-1 < iVar1) {
            iVar2 = iVar1;
          }
          pbVar10 = (bitvec_t *)
                    __ckd_calloc__((long)(iVar2 >> 5),4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                                   ,0x10f);
          acmod->senone_active_vec = pbVar10;
          puVar11 = (uint8 *)__ckd_calloc__((long)acmod->mdef->n_sen,1,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                                            ,0x111);
          acmod->senone_active = puVar11;
          iVar1 = logmath_get_zero(acmod->lmath);
          acmod->log_zero = iVar1;
          iVar1 = ps_config_bool(config,"compallsen");
          acmod->compallsen = (uint8)iVar1;
          return acmod;
        }
        mllr = ps_mllr_read(pcVar5);
        if (mllr != (ps_mllr_t *)0x0) {
          acmod_update_mllr(acmod,mllr);
          goto LAB_0011d46b;
        }
        goto LAB_0011d38b;
      }
      pcVar5 = "No mean/var/tmat files specified\n";
      lVar12 = 0x60;
    }
  }
LAB_0011d37f:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c",
          lVar12,pcVar5);
LAB_0011d38b:
  acmod_free(acmod);
  return (acmod_t *)0x0;
}

Assistant:

acmod_t *
acmod_init(ps_config_t *config, logmath_t *lmath, fe_t *fe, feat_t *fcb)
{
    acmod_t *acmod;

    acmod = ckd_calloc(1, sizeof(*acmod));
    acmod->config = ps_config_retain(config);
    acmod->lmath = logmath_retain(lmath);
    acmod->state = ACMOD_IDLE;

    /* Initialize or retain fe and fcb. */
    if (acmod_reinit_feat(acmod, fe, fcb) < 0)
        goto error_out;

    /* Load acoustic model parameters. */
    if (acmod_init_am(acmod) < 0)
        goto error_out;

    /* Senone computation stuff. */
    acmod->senone_scores = ckd_calloc(bin_mdef_n_sen(acmod->mdef),
                                                     sizeof(*acmod->senone_scores));
    acmod->senone_active_vec = bitvec_alloc(bin_mdef_n_sen(acmod->mdef));
    acmod->senone_active = ckd_calloc(bin_mdef_n_sen(acmod->mdef),
                                                     sizeof(*acmod->senone_active));
    acmod->log_zero = logmath_get_zero(acmod->lmath);
    acmod->compallsen = ps_config_bool(config, "compallsen");
    return acmod;

error_out:
    acmod_free(acmod);
    return NULL;
}